

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

void repeat_cb(uv_timer_t *handle)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  int64_t eval_b;
  int64_t eval_a;
  
  puts("REPEAT_CB");
  if (handle == (uv_timer_t *)0x0) {
    pcVar5 = "!=";
    pcVar8 = "!=";
    lVar2 = 0;
    uVar7 = 0;
    pcVar6 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar4 = "handle";
    uVar3 = 99;
  }
  else {
    iVar1 = uv_is_active(handle);
    lVar2 = (long)iVar1;
    if (lVar2 == 1) {
      repeat_cb_called = repeat_cb_called + 1;
      if (repeat_cb_called == 5) {
        uv_close(handle,repeat_close_cb);
        return;
      }
      return;
    }
    pcVar5 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar4 = "1";
    uVar3 = 100;
    pcVar8 = "==";
    uVar7 = 1;
    pcVar6 = "uv_is_active((uv_handle_t*) handle)";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,uVar7,pcVar8,lVar2);
  abort();
}

Assistant:

static void repeat_cb(uv_timer_t* handle) {
  printf("REPEAT_CB\n");

  ASSERT_NOT_NULL(handle);
  ASSERT_EQ(1, uv_is_active((uv_handle_t*) handle));

  repeat_cb_called++;

  if (repeat_cb_called == 5) {
    uv_close((uv_handle_t*)handle, repeat_close_cb);
  }
}